

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O2

int __thiscall cmCTestUpdateHandler::DetectVCS(cmCTestUpdateHandler *this,string *dir)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  string local_200;
  string sourceDirectory;
  cmAlphaNum local_1c0;
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::string::string((string *)&sourceDirectory,(string *)dir);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"Check directory: ");
  poVar2 = std::operator<<(poVar2,(string *)&sourceDirectory);
  std::endl<char,std::char_traits<char>>(poVar2);
  this_00 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x10a,(char *)local_1c0.View_._M_len,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::append((char *)&sourceDirectory);
  bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
  if (bVar1) {
    iVar3 = 2;
  }
  else {
    _cmCTestLog_msg = dir->_M_string_length;
    local_1c0.View_._M_len = 4;
    local_1c0.View_._M_str = "/CVS";
    cmStrCat<>(&local_200,(cmAlphaNum *)&cmCTestLog_msg,&local_1c0);
    std::__cxx11::string::operator=((string *)&sourceDirectory,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
    if (bVar1) {
      iVar3 = 1;
    }
    else {
      _cmCTestLog_msg = dir->_M_string_length;
      local_1c0.View_._M_len = 5;
      local_1c0.View_._M_str = "/.bzr";
      cmStrCat<>(&local_200,(cmAlphaNum *)&cmCTestLog_msg,&local_1c0);
      std::__cxx11::string::operator=((string *)&sourceDirectory,(string *)&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
      if (bVar1) {
        iVar3 = 3;
      }
      else {
        _cmCTestLog_msg = dir->_M_string_length;
        local_1c0.View_._M_len = 5;
        local_1c0.View_._M_str = "/.git";
        cmStrCat<>(&local_200,(cmAlphaNum *)&cmCTestLog_msg,&local_1c0);
        std::__cxx11::string::operator=((string *)&sourceDirectory,(string *)&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
        if (bVar1) {
          iVar3 = 4;
        }
        else {
          _cmCTestLog_msg = dir->_M_string_length;
          local_1c0.View_._M_len = 4;
          local_1c0.View_._M_str = "/.hg";
          cmStrCat<>(&local_200,(cmAlphaNum *)&cmCTestLog_msg,&local_1c0);
          std::__cxx11::string::operator=((string *)&sourceDirectory,(string *)&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
          if (bVar1) {
            iVar3 = 5;
          }
          else {
            _cmCTestLog_msg = dir->_M_string_length;
            local_1c0.View_._M_len = 4;
            local_1c0.View_._M_str = "/.p4";
            cmStrCat<>(&local_200,(cmAlphaNum *)&cmCTestLog_msg,&local_1c0);
            std::__cxx11::string::operator=((string *)&sourceDirectory,(string *)&local_200);
            std::__cxx11::string::~string((string *)&local_200);
            bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
            if (bVar1) {
              iVar3 = 6;
            }
            else {
              _cmCTestLog_msg = dir->_M_string_length;
              local_1c0.View_._M_len = 10;
              local_1c0.View_._M_str = "/.p4config";
              cmStrCat<>(&local_200,(cmAlphaNum *)&cmCTestLog_msg,&local_1c0);
              std::__cxx11::string::operator=((string *)&sourceDirectory,(string *)&local_200);
              std::__cxx11::string::~string((string *)&local_200);
              bVar1 = cmsys::SystemTools::FileExists(&sourceDirectory);
              iVar3 = 6;
              if (!bVar1) {
                iVar3 = 0;
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&sourceDirectory);
  return iVar3;
}

Assistant:

int cmCTestUpdateHandler::DetectVCS(const std::string& dir)
{
  std::string sourceDirectory = dir;
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Check directory: " << sourceDirectory << std::endl,
                     this->Quiet);
  sourceDirectory += "/.svn";
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_SVN;
  }
  sourceDirectory = cmStrCat(dir, "/CVS");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_CVS;
  }
  sourceDirectory = cmStrCat(dir, "/.bzr");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_BZR;
  }
  sourceDirectory = cmStrCat(dir, "/.git");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_GIT;
  }
  sourceDirectory = cmStrCat(dir, "/.hg");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_HG;
  }
  sourceDirectory = cmStrCat(dir, "/.p4");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_P4;
  }
  sourceDirectory = cmStrCat(dir, "/.p4config");
  if (cmSystemTools::FileExists(sourceDirectory)) {
    return cmCTestUpdateHandler::e_P4;
  }
  return cmCTestUpdateHandler::e_UNKNOWN;
}